

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes SkipData(CSzData *sd)

{
  SRes SVar1;
  UInt64 size;
  ulong local_10;
  
  SVar1 = ReadNumber(sd,&local_10);
  if (SVar1 == 0) {
    SVar1 = 0x10;
    if (local_10 <= sd->Size) {
      sd->Size = sd->Size - local_10;
      sd->Data = sd->Data + local_10;
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

static SRes SkipData(CSzData *sd)
{
  UInt64 size;
  RINOK(ReadNumber(sd, &size));
  if (size > sd->Size)
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, size);
  return SZ_OK;
}